

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::appendToByteArray<char,QByteArrayView&>
          (QByteArray *a,QStringBuilder<char,_QByteArrayView_&> *b,char param_3)

{
  ArrayOptions *pAVar1;
  char *pcVar2;
  size_t __n;
  long lVar3;
  Data *pDVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pDVar4 = (a->d).d;
  lVar5 = (a->d).size;
  lVar8 = lVar5 + b->b->m_size + 1;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)lVar5);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) goto LAB_00194ed3;
    if (0 < lVar8) {
      lVar5 = (a->d).size;
      goto LAB_00194f22;
    }
  }
  else {
LAB_00194ed3:
    lVar6 = (pDVar4->super_QArrayData).alloc;
    pcVar2 = (a->d).ptr;
    lVar5 = (a->d).size;
    lVar7 = ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar6;
    if ((lVar7 - lVar5) - (long)pcVar2 < lVar8) {
      lVar3 = lVar6 * 2;
      if (lVar6 * 2 < lVar8) {
        lVar3 = lVar8;
      }
      lVar8 = lVar3;
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar7 - (long)pcVar2 < lVar8)) {
LAB_00194f22:
        if (lVar8 < lVar5) {
          lVar8 = lVar5;
        }
        QByteArray::reallocData((longlong)a,(AllocationOption)lVar8);
        pDVar4 = (a->d).d;
        if (pDVar4 == (Data *)0x0) goto LAB_00194f52;
        lVar6 = (pDVar4->super_QArrayData).alloc;
      }
      if (lVar6 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_00194f63;
  }
LAB_00194f52:
  QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_00194f63:
  pcVar2 = (a->d).ptr;
  lVar5 = (a->d).size;
  pcVar2[lVar5] = b->a;
  __n = b->b->m_size;
  if (__n != 0) {
    memcpy(pcVar2 + lVar5 + 1,b->b->m_data,__n);
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}